

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O3

size_t google::protobuf::internal::MapValueRefDataOnlyByteSize
                 (FieldDescriptor *field,MapValueConstRef *value)

{
  long lVar1;
  uint32_t uVar2;
  int iVar3;
  int32_t iVar4;
  uint uVar5;
  size_t sVar6;
  int64_t iVar7;
  ulong uVar8;
  Message *pMVar9;
  undefined4 extraout_var;
  string_view sVar10;
  LogMessage LStack_18;
  
  switch((uint)field & 0xff) {
  case 1:
  case 6:
  case 0x10:
    sVar6 = 8;
    break;
  case 2:
  case 7:
  case 0xf:
    sVar6 = 4;
    break;
  case 3:
    uVar8 = MapValueConstRef::GetInt64Value(value);
    goto LAB_00268698;
  case 4:
    uVar8 = MapValueConstRef::GetUInt64Value(value);
    goto LAB_00268698;
  case 5:
    uVar5 = MapValueConstRef::GetInt32Value(value);
    goto LAB_002686a6;
  case 8:
    sVar6 = 1;
    break;
  case 9:
  case 0xc:
    sVar10 = MapValueConstRef::GetStringValue(value);
    sVar6 = sVar10._M_len;
    goto LAB_002686cb;
  case 10:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&LStack_18,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format.cc"
               ,0x62a);
    absl::lts_20250127::log_internal::LogMessage::operator<<
              (&LStack_18,(char (*) [12])"Unsupported");
    goto LAB_00268750;
  case 0xb:
    pMVar9 = MapValueConstRef::GetMessageValue(value);
    iVar3 = (*(pMVar9->super_MessageLite)._vptr_MessageLite[3])(pMVar9);
    sVar6 = CONCAT44(extraout_var,iVar3);
LAB_002686cb:
    uVar5 = (uint)sVar6 | 1;
    iVar3 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> iVar3 == 0; iVar3 = iVar3 + -1) {
      }
    }
    sVar6 = (iVar3 * 9 + 0x49U >> 6) + sVar6;
    break;
  case 0xd:
    uVar2 = MapValueConstRef::GetUInt32Value(value);
    iVar3 = 0x1f;
    if ((uVar2 | 1) != 0) {
      for (; (uVar2 | 1) >> iVar3 == 0; iVar3 = iVar3 + -1) {
      }
    }
    goto LAB_002686af;
  case 0xe:
    uVar5 = MapValueConstRef::GetEnumValue(value);
LAB_002686a6:
    uVar8 = (ulong)(int)(uVar5 | 1);
    goto LAB_002686ab;
  case 0x11:
    iVar4 = MapValueConstRef::GetInt32Value(value);
    uVar5 = iVar4 >> 0x1f ^ iVar4 * 2 | 1;
    iVar3 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> iVar3 == 0; iVar3 = iVar3 + -1) {
      }
    }
    goto LAB_002686af;
  case 0x12:
    iVar7 = MapValueConstRef::GetInt64Value(value);
    uVar8 = iVar7 >> 0x3f ^ iVar7 * 2;
LAB_00268698:
    uVar8 = uVar8 | 1;
LAB_002686ab:
    lVar1 = 0x3f;
    if (uVar8 != 0) {
      for (; uVar8 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    iVar3 = (int)lVar1;
LAB_002686af:
    sVar6 = (size_t)(iVar3 * 9 + 0x49U >> 6);
    break;
  default:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&LStack_18,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format.cc"
               ,0x64a);
    absl::lts_20250127::log_internal::LogMessage::operator<<
              (&LStack_18,(char (*) [16])"Cannot get here");
LAB_00268750:
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&LStack_18);
  }
  return sVar6;
}

Assistant:

static size_t MapValueRefDataOnlyByteSize(const FieldDescriptor* field,
                                          const MapValueConstRef& value) {
  switch (field->type()) {
    case FieldDescriptor::TYPE_GROUP:
      ABSL_LOG(FATAL) << "Unsupported";
      return 0;
#define CASE_TYPE(FieldType, CamelFieldType, CamelCppType) \
  case FieldDescriptor::TYPE_##FieldType:                  \
    return WireFormatLite::CamelFieldType##Size(           \
        value.Get##CamelCppType##Value());

#define FIXED_CASE_TYPE(FieldType, CamelFieldType) \
  case FieldDescriptor::TYPE_##FieldType:          \
    return WireFormatLite::k##CamelFieldType##Size;

      CASE_TYPE(INT32, Int32, Int32);
      CASE_TYPE(INT64, Int64, Int64);
      CASE_TYPE(UINT32, UInt32, UInt32);
      CASE_TYPE(UINT64, UInt64, UInt64);
      CASE_TYPE(SINT32, SInt32, Int32);
      CASE_TYPE(SINT64, SInt64, Int64);
      CASE_TYPE(STRING, String, String);
      CASE_TYPE(BYTES, Bytes, String);
      CASE_TYPE(ENUM, Enum, Enum);
      CASE_TYPE(MESSAGE, Message, Message);
      FIXED_CASE_TYPE(FIXED32, Fixed32);
      FIXED_CASE_TYPE(FIXED64, Fixed64);
      FIXED_CASE_TYPE(SFIXED32, SFixed32);
      FIXED_CASE_TYPE(SFIXED64, SFixed64);
      FIXED_CASE_TYPE(DOUBLE, Double);
      FIXED_CASE_TYPE(FLOAT, Float);
      FIXED_CASE_TYPE(BOOL, Bool);

#undef CASE_TYPE
#undef FIXED_CASE_TYPE
  }
  ABSL_LOG(FATAL) << "Cannot get here";
  return 0;
}